

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

reporterMap * doctest::anon_unknown_14::getReporters(void)

{
  undefined1 extraout_AL;
  undefined7 in_register_00000001;
  undefined7 extraout_var;
  
  if ((anonymous_namespace)::getReporters()::data != '\0') {
    return (reporterMap *)CONCAT71(in_register_00000001,(anonymous_namespace)::getReporters()::data)
    ;
  }
  _GLOBAL__N_1::getReporters();
  return (reporterMap *)CONCAT71(extraout_var,extraout_AL);
}

Assistant:

reporterMap& getReporters() {
        static reporterMap data;
        return data;
    }